

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

void linenoiseEditStop(linenoiseState *l)

{
  int iVar1;
  
  iVar1 = isatty(l->ifd);
  if (iVar1 != 0) {
    if (rawmode == '\x01') {
      iVar1 = tcsetattr(l->ifd,2,(termios *)&orig_termios);
      if (iVar1 != -1) {
        rawmode = '\0';
      }
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void linenoiseEditStop(struct linenoiseState *l) {
    if (!isatty(l->ifd)) return;
    disableRawMode(l->ifd);
    printf("\n");
}